

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

_Bool run_container_equals_bitset(run_container_t *container1,bitset_container_t *container2)

{
  ushort pos;
  _Bool _Var1;
  int iVar2;
  int local_38;
  uint32_t end;
  uint32_t begin;
  int32_t i;
  int bitset_card;
  int run_card;
  bitset_container_t *container2_local;
  run_container_t *container1_local;
  
  iVar2 = run_container_cardinality(container1);
  if (container2->cardinality == -1) {
    local_38 = bitset_container_compute_cardinality(container2);
  }
  else {
    local_38 = container2->cardinality;
  }
  if (local_38 == iVar2) {
    for (end = 0; (int)end < container1->n_runs; end = end + 1) {
      pos = container1->runs[(int)end].value;
      if (container1->runs[(int)end].length == 0) {
        _Var1 = bitset_container_contains(container2,pos);
        if (!_Var1) {
          return false;
        }
      }
      else {
        _Var1 = bitset_container_contains_range
                          (container2,(uint)pos,
                           (uint)pos + (uint)container1->runs[(int)end].length + 1);
        if (!_Var1) {
          return false;
        }
      }
    }
    container1_local._7_1_ = true;
  }
  else {
    container1_local._7_1_ = false;
  }
  return container1_local._7_1_;
}

Assistant:

bool run_container_equals_bitset(const run_container_t* container1,
                                 const bitset_container_t* container2) {

    int run_card = run_container_cardinality(container1);
    int bitset_card = (container2->cardinality != BITSET_UNKNOWN_CARDINALITY) ?
                      container2->cardinality :
                      bitset_container_compute_cardinality(container2);
    if (bitset_card != run_card) {
        return false;
    }

    for (int32_t i = 0; i < container1->n_runs; i++) {
        uint32_t begin = container1->runs[i].value;
        if (container1->runs[i].length) {
            uint32_t end = begin + container1->runs[i].length + 1;
            if (!bitset_container_contains_range(container2, begin, end)) {
                return false;
            }
        } else {
            if (!bitset_container_contains(container2, begin)) {
                return false;
            }
        }
    }

    return true;
}